

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_5x5_int8.h
# Opt level: O2

void ncnn::conv5x5s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  vector<float,_std::allocator<float>_> scale_dequant;
  pointer in_stack_ffffffffffffffb8;
  Option *in_stack_ffffffffffffffc0;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffb8,scales_dequant);
  scale_dequant.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)opt;
  scale_dequant.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&stack0xffffffffffffffb8;
  scale_dequant.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffffb8;
  conv_im2col_sgemm_int8_dequant_sse
            (bottom_blob,top_blob,_kernel,5,5,1,1,_bias,scale_dequant,in_stack_ffffffffffffffc0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

static void conv5x5s1_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int kernel_w = 5;
    int kernel_h = 5;

    int stride_w = 1;
    int stride_h = 1;

    conv_im2col_sgemm_int8_dequant_sse(bottom_blob, top_blob, _kernel, kernel_w, kernel_h, stride_w, stride_h, _bias, scales_dequant, opt);
}